

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall File::load(File *this,string *fileName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer ppTVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  File *this_00;
  stringstream stream;
  ifstream file;
  File local_3b0 [3];
  ios_base local_330 [264];
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(fileName->_M_dataplus)._M_p,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    this_00 = local_3b0;
    std::__cxx11::stringstream::stringstream((stringstream *)this_00);
    file2StringStream(this_00,(ifstream *)local_228,(stringstream *)local_3b0);
    ppTVar4 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar6 = true;
    if ((this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppTVar4) {
      uVar5 = 0;
      uVar7 = 1;
      do {
        iVar2 = (*(ppTVar4[uVar5]->super_StreamObject)._vptr_StreamObject[1])
                          (ppTVar4[uVar5],local_3b0);
        if ((char)iVar2 == '\0') {
          std::ifstream::close();
          bVar6 = false;
          break;
        }
        ppTVar4 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar1 = uVar7 < (ulong)((long)(this->_tags).
                                      super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3);
        uVar5 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3b0);
    std::ios_base::~ios_base(local_330);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: File \"",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" doesn\'t exist!",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar6 = false;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_228);
  return bVar6;
}

Assistant:

bool File::load( std::string fileName )
{
	bool success = true;

	std::ifstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: File \"" << fileName << "\" doesn't exist!" << std::endl;
		success = false;
        } else {

            std::stringstream stream;

            file2StringStream( file, stream );

            for ( unsigned int i = 0; i < elements().size();i++ ) {
		success = elements()[i]->read( stream );

		if ( !success )
		{
			file.close();
			break;
		}
            }
        }

	file.close();

	return success;
}